

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O2

apx_error_t apx_nodeInstance_finalize_node_data(apx_nodeInstance_t *self)

{
  apx_nodeData_t *self_00;
  apx_error_t aVar1;
  
  if (self == (apx_nodeInstance_t *)0x0) {
    aVar1 = 1;
  }
  else {
    self_00 = self->node_data;
    if (self_00 == (apx_nodeData_t *)0x0) {
      aVar1 = 0x24;
    }
    else if ((self->provide_port_init_data == (uint8_t *)0x0) ||
            (aVar1 = apx_nodeData_create_provide_port_data
                               (self_00,self->num_provide_ports,self->provide_port_init_data,
                                self->provide_port_init_data_size), aVar1 == 0)) {
      if (self->require_port_init_data != (uint8_t *)0x0) {
        aVar1 = apx_nodeData_create_require_port_data
                          (self_00,self->num_require_ports,self->require_port_init_data,
                           self->require_port_init_data_size);
        return aVar1;
      }
      aVar1 = 0;
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_nodeInstance_finalize_node_data(apx_nodeInstance_t* self)
{
   if (self != NULL)
   {
      apx_error_t retval = APX_NO_ERROR;
      apx_nodeData_t* node_data = self->node_data;
      if (node_data != NULL)
      {
         if (apx_nodeInstance_has_provide_port_data(self))
         {
            retval = apx_nodeData_create_provide_port_data(node_data, self->num_provide_ports, self->provide_port_init_data, self->provide_port_init_data_size);
         }
         if ((retval == APX_NO_ERROR) && apx_nodeInstance_has_require_port_data(self))
         {
            retval = apx_nodeData_create_require_port_data(node_data, self->num_require_ports, self->require_port_init_data, self->require_port_init_data_size);
         }
      }
      else
      {
         retval = APX_NULL_PTR_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}